

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonProcessingFunctions.cpp
# Opt level: O1

bool __thiscall helics::fileops::looksLikeConfigJson(fileops *this,string_view jsonString)

{
  string_view jsonString_00;
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  size_type sVar4;
  void *pvVar5;
  ulong uVar6;
  string_view sVar8;
  char *in_stack_ffffffffffffffd8;
  string_view local_20;
  size_t sVar7;
  
  local_20._M_str = (char *)jsonString._M_len;
  local_20._M_len = (size_t)this;
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_20,"\n#",0,2);
  if (sVar4 == 0xffffffffffffffff) {
    sVar8._M_str = in_stack_ffffffffffffffd8;
    sVar8._M_len = 0x3aabf8;
    local_20 = removeSpaceAndComment(sVar8);
    if ((6 < local_20._M_len) && (*local_20._M_str == '{')) {
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_20,"\"\'",0,2);
      if (sVar4 == 0xffffffffffffffff) {
        return false;
      }
      sVar2 = local_20._M_len;
      if (local_20._M_len != 0) {
        pcVar3 = local_20._M_str;
        pvVar5 = memchr(local_20._M_str,0x3a,local_20._M_len);
        if ((long)pvVar5 - (long)pcVar3 != -1 && pvVar5 != (void *)0x0) {
          sVar7 = sVar2;
          do {
            uVar6 = sVar7 - 1;
            if (sVar7 == 0) {
              uVar6 = 0xffffffffffffffff;
              break;
            }
            lVar1 = sVar7 - 1;
            sVar7 = uVar6;
          } while (local_20._M_str[lVar1] != '}');
          if (uVar6 != 0xffffffffffffffff) {
            if (sVar2 <= uVar6) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",uVar6 + 1,sVar2);
            }
            jsonString_00._M_str = in_stack_ffffffffffffffd8;
            jsonString_00._M_len = 0x3aacb2;
            sVar8 = removeSpaceAndComment(jsonString_00);
            return sVar8._M_len == 0;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool looksLikeConfigJson(std::string_view jsonString)
{
    if (jsonString.find("\n#") != std::string_view::npos) {
        return false;
    }
    jsonString = removeSpaceAndComment(jsonString);
    if (jsonString.size() < 7) {
        // minimum viable config file is 7 characters {"f":4}
        return false;
    }

    if (jsonString.front() != '{') {
        return false;
    }
    auto firstQuote = jsonString.find_first_of("\"'");
    if (firstQuote == std::string_view::npos) {
        return false;
    }
    auto firstColonLoc = jsonString.find_first_of(':');
    if (firstColonLoc == std::string_view::npos) {
        return false;
    }
    auto closeBracket = jsonString.find_last_of('}');
    if (closeBracket == std::string_view::npos) {
        return false;
    }

    auto afterBracket = removeSpaceAndComment(jsonString.substr(closeBracket + 1));
    return afterBracket.empty();
}